

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_Boolean UA_NodeId_equal(UA_NodeId *n1,UA_NodeId *n2)

{
  UA_NodeId *n2_local;
  UA_NodeId *n1_local;
  
  if ((n1->namespaceIndex == n2->namespaceIndex) && (n1->identifierType == n2->identifierType)) {
    switch(n1->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
      if ((n1->identifier).numeric == (n2->identifier).numeric) {
        n1_local._7_1_ = true;
      }
      else {
        n1_local._7_1_ = false;
      }
      break;
    default:
      n1_local._7_1_ = false;
      break;
    case UA_NODEIDTYPE_STRING:
      n1_local._7_1_ = UA_String_equal(&(n1->identifier).string,&(n2->identifier).string);
      break;
    case UA_NODEIDTYPE_GUID:
      n1_local._7_1_ = UA_Guid_equal(&(n1->identifier).guid,&(n2->identifier).guid);
      break;
    case UA_NODEIDTYPE_BYTESTRING:
      n1_local._7_1_ =
           UA_ByteString_equal(&(n1->identifier).byteString,&(n2->identifier).byteString);
    }
  }
  else {
    n1_local._7_1_ = false;
  }
  return n1_local._7_1_;
}

Assistant:

UA_Boolean
UA_NodeId_equal(const UA_NodeId *n1, const UA_NodeId *n2) {
    if(n1->namespaceIndex != n2->namespaceIndex ||
       n1->identifierType!=n2->identifierType)
        return false;
    switch(n1->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
        if(n1->identifier.numeric == n2->identifier.numeric)
            return true;
        else
            return false;
    case UA_NODEIDTYPE_STRING:
        return UA_String_equal(&n1->identifier.string,
                               &n2->identifier.string);
    case UA_NODEIDTYPE_GUID:
        return UA_Guid_equal(&n1->identifier.guid,
                             &n2->identifier.guid);
    case UA_NODEIDTYPE_BYTESTRING:
        return UA_ByteString_equal(&n1->identifier.byteString,
                                   &n2->identifier.byteString);
    }
    return false;
}